

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_complib.c
# Opt level: O3

int load_and_compile_internal(lua_State *L,char *s,char *options)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t len;
  MIR_module_t_conflict module;
  code *pcVar4;
  LClosure *cl;
  uint uVar5;
  int optlevel;
  CompilerContext ccontext;
  C_MemoryAllocator allocator;
  lua_State *local_d8;
  ravi_State *local_d0;
  mspace local_c8;
  code *local_c0;
  code *local_b8;
  code *local_b0;
  code *local_a8;
  code *local_a0;
  undefined1 *local_98;
  char *local_90;
  size_t local_88;
  char *local_80;
  char *local_78;
  char local_70 [32];
  mspace *local_50;
  char *local_48;
  code *local_40;
  code *local_38;
  
  local_d0 = L->l_G->ravi_state;
  local_d8 = L;
  local_c8 = create_mspace(0,0);
  local_c0 = mspace_realloc;
  local_b8 = mspace_calloc;
  local_b0 = mspace_free;
  local_a8 = create_mspace;
  local_a0 = destroy_mspace;
  local_98 = (undefined1 *)&local_d8;
  local_90 = s;
  local_88 = strlen(s);
  local_80 = "input";
  local_70[0] = '\0';
  local_70[1] = '\0';
  local_70[2] = '\0';
  local_70[3] = '\0';
  local_70[4] = '\0';
  local_70[5] = '\0';
  local_70[6] = '\0';
  local_70[7] = '\0';
  local_70[8] = '\0';
  local_70[9] = '\0';
  local_70[10] = '\0';
  local_70[0xb] = '\0';
  local_70[0xc] = '\0';
  local_70[0xd] = '\0';
  local_70[0xe] = '\0';
  local_70[0xf] = 0;
  local_70[0x10] = '\0';
  local_70[0x11] = '\0';
  local_70[0x12] = '\0';
  local_70[0x13] = '\0';
  local_70[0x14] = '\0';
  local_70[0x15] = '\0';
  local_70[0x16] = '\0';
  local_70[0x17] = '\0';
  local_70[0x18] = '\0';
  local_70[0x19] = '\0';
  local_70[0x1a] = '\0';
  local_70[0x1b] = '\0';
  local_70[0x1c] = '\0';
  local_70[0x1d] = '\0';
  local_70[0x1e] = '\0';
  local_48 = (char *)0x0;
  local_40 = debug_message;
  local_38 = error_message;
  local_50 = &local_c8;
  iVar1 = raviV_getoptlevel(L);
  pcVar2 = strstr(options,"-O3");
  optlevel = 3;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strstr(options,"-O2");
    optlevel = 2;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strstr(options,"-O1");
      optlevel = 1;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strstr(options,"-O0");
        optlevel = 0;
        if (pcVar2 == (char *)0x0) {
          optlevel = iVar1;
        }
      }
    }
  }
  local_d0->id = local_d0->id + 1;
  snprintf(local_70,0x1f,"__luachunk_%lld");
  local_78 = options;
  iVar1 = raviX_compile(&local_98);
  pcVar2 = local_48;
  if (local_48 != (char *)0x0) {
    pcVar3 = strstr(options,"--verbose");
    if (pcVar3 != (char *)0x0) {
      len = strlen(pcVar2);
      ravi_writestring(L,pcVar2,len);
    }
  }
  if (iVar1 == 0) {
    mir_prepare(local_d0->jit,optlevel);
    module = mir_compile_C_module(&local_d0->options,local_d0->jit,local_48,"input");
    if (module == (MIR_module_t_conflict)0x0) {
      pcVar4 = (code *)0x0;
    }
    else {
      pcVar4 = (code *)mir_get_func(local_d0->jit,module,local_70);
    }
    mir_cleanup(local_d0->jit);
    if (pcVar4 != (code *)0x0) {
      cl = (LClosure *)(*pcVar4)(L);
      if (cl->p->sizeupvalues != (uint)cl->nupvalues) {
        __assert_fail("cl->nupvalues == cl->p->sizeupvalues",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ravi_complib.c"
                      ,0x41,"void setup_lua_closure(lua_State *, LClosure *(*)(lua_State *))");
      }
      luaF_initupvals(L,cl);
      ravi_closure_setenv(L);
    }
    uVar5 = (uint)(pcVar4 != (code *)0x0);
    raviX_release(&local_98);
    destroy_mspace(local_c8);
  }
  else {
    destroy_mspace(local_c8);
    uVar5 = 0;
  }
  return uVar5;
}

Assistant:

static int load_and_compile_internal(lua_State* L, const char* s, const char* options) {
  struct CompilerContext ccontext = {.L = L, .jit = G(L)->ravi_state};
  C_MemoryAllocator allocator = {.arena = create_mspace(0, 0),
                                 .create_arena = create_mspace,
                                 .destroy_arena = destroy_mspace,
                                 .calloc = mspace_calloc,
                                 .realloc = mspace_realloc,
                                 .free = mspace_free};
  Ravi_CompilerInterface ravicomp_interface = {.source = s,
                                               .source_len = strlen(s),
                                               .source_name = "input",
                                               .generated_code = NULL,
                                               .context = &ccontext,
                                               .memory_allocator = &allocator,
                                               .debug_message = debug_message,
                                               .error_message = error_message};
  int opt_level = raviV_getoptlevel(L); // Get default opt level
  if (strstr(options, "-O3")) opt_level = 3;
  else if (strstr(options, "-O2")) opt_level = 2;
  else if (strstr(options, "-O1")) opt_level = 1;
  else if (strstr(options, "-O0")) opt_level = 0;
#ifdef USE_MIRJIT
  snprintf(ravicomp_interface.main_func_name, sizeof ravicomp_interface.main_func_name, "__luachunk_%lld",
           ccontext.jit->id++);
#else
  snprintf(ravicomp_interface.main_func_name, sizeof ravicomp_interface.main_func_name, "mymain");
#endif
  ravicomp_interface.compiler_options = options;
  /* Generate C code */
  int rc = raviX_compile(&ravicomp_interface);
  if (ravicomp_interface.generated_code && strstr(options, "--verbose") != NULL) {
    ravi_writestring(L, ravicomp_interface.generated_code, strlen(ravicomp_interface.generated_code));
  }
  if (rc == 0) {
#ifdef USE_MIRJIT
    /* Compile C code */
    LClosure* (*load_in_lua)(lua_State * L) = NULL;
    mir_prepare(ccontext.jit->jit, opt_level);
    MIR_module_t M =
        mir_compile_C_module(&ccontext.jit->options, ccontext.jit->jit, ravicomp_interface.generated_code, "input");
    if (M != NULL) {
      load_in_lua = mir_get_func(ccontext.jit->jit, M, ravicomp_interface.main_func_name);
    }
    mir_cleanup(ccontext.jit->jit);
    if (load_in_lua != NULL) {
      /* Execute compiled code */
      setup_lua_closure(L, load_in_lua);
    }
    else {
      rc = -1;
    }
    raviX_release(&ravicomp_interface);
    destroy_mspace(allocator.arena);
    // If successful the closure will be left on top of stack
    return rc == 0 ? 1 : 0;
#else
    raviX_release(&ravicomp_interface);
    destroy_mspace(allocator.arena);
    return 0;
#endif
  }
  else {
    destroy_mspace(allocator.arena);
    return 0;
  }
}